

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O1

spv_result_t spvtools::val::TypePass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint16_t uVar2;
  pointer ppVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int32_t iVar7;
  uint uVar8;
  spv_result_t sVar9;
  StorageClass SVar10;
  StorageClass SVar11;
  DiagnosticStream *pDVar12;
  Instruction *pIVar13;
  pointer puVar14;
  mapped_type *pmVar15;
  mapped_type *pmVar16;
  _Base_ptr p_Var17;
  long lVar18;
  mapped_type mVar19;
  spv_result_t unaff_EBP;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> *pair;
  pointer ppVar20;
  char *pcVar21;
  Op opcode;
  size_t sVar22;
  ulong uVar23;
  _Rb_tree_header *p_Var24;
  _Any_data *this;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  built_in_members;
  vector<unsigned_int,_std::allocator<unsigned_int>_> const_inst;
  int64_t length_value;
  __node_gen_type __node_gen;
  spv_result_t local_2b0;
  undefined1 local_2a8 [32];
  float local_288;
  size_t local_280;
  __node_base_ptr p_Stack_278;
  uint local_26c;
  _Any_data local_268;
  undefined1 local_258 [20];
  int iStack_244;
  __node_base_ptr local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  __node_base local_228;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_220;
  _Rb_tree_color local_208;
  spv_result_t local_58;
  string local_50;
  
  iVar7 = spvOpcodeGeneratesType((uint)(inst->inst_).opcode);
  if ((iVar7 == 0) && ((inst->inst_).opcode != 0x27)) {
    return SPV_SUCCESS;
  }
  bVar4 = EnumSet<spvtools::Extension>::contains
                    (&_->module_extensions_,kSPV_VALIDATOR_ignore_type_decl_unique);
  sVar9 = SPV_SUCCESS;
  if (!bVar4) {
    uVar1 = (inst->inst_).opcode;
    if ((((0x20 < (ulong)uVar1) || ((0x170000000U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
        (uVar1 != OpTypeUntypedPointerKHR)) &&
       (bVar4 = ValidationState_t::RegisterUniqueTypeDeclaration(_,inst), sVar9 = SPV_SUCCESS,
       !bVar4)) {
      ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,
                 "Duplicate non-aggregate type declarations are not allowed. Opcode: ",0x43);
      local_2a8._0_8_ = spvOpcodeString((uint)uVar1);
      pDVar12 = DiagnosticStream::operator<<((DiagnosticStream *)&local_228,(char **)local_2a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar12," id: ",5);
      std::ostream::_M_insert<unsigned_long>((ulong)pDVar12);
      sVar9 = pDVar12->error_;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_228);
    }
  }
  if (sVar9 != SPV_SUCCESS) {
    return sVar9;
  }
  uVar1 = (inst->inst_).opcode;
  if (0x1140 < uVar1) {
    if (uVar1 == 0x1141) {
      bVar4 = spvIsVulkanEnv(_->context_->target_env);
      if (!bVar4) goto LAB_0030d0ba;
      SVar11 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
      bVar4 = true;
      if ((int)SVar11 < 9) {
        local_2b0 = unaff_EBP;
        if (SVar11 != Uniform) {
          if (SVar11 != Workgroup) goto LAB_0030d073;
          bVar6 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,WorkgroupMemoryExplicitLayoutKHR);
          if (!bVar6) {
            ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
            pcVar21 = 
            "Workgroup storage class untyped pointers in Vulkan require WorkgroupMemoryExplicitLayoutKHR be declared"
            ;
            lVar18 = 0x67;
            goto LAB_0030d09a;
          }
        }
      }
      else {
        local_2b0 = unaff_EBP;
        if (((SVar11 != PushConstant) && (SVar11 != StorageBuffer)) &&
           (SVar11 != PhysicalStorageBuffer)) {
LAB_0030d073:
          ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
          pcVar21 = 
          "In Vulkan, untyped pointers can only be used in an explicitly laid out storage class";
          lVar18 = 0x54;
LAB_0030d09a:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar21,lVar18);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_228);
          bVar4 = false;
          local_2b0 = local_58;
        }
      }
      if (bVar4) goto LAB_0030d0ba;
      goto LAB_0030d33e;
    }
    if ((uVar1 == 0x1168) || (uVar1 == 0x14ee)) {
      uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,1);
      pIVar13 = ValidationState_t::FindDef(_,uVar8);
      if ((pIVar13 == (Instruction *)0x0) || (1 < (pIVar13->inst_).opcode - 0x15)) {
        ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,"OpTypeCooperativeMatrix Component Type <id> ",0x2c);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,uVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
        pcVar21 = " is not a scalar numerical type.";
        lVar18 = 0x20;
      }
      else {
        uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        pIVar13 = ValidationState_t::FindDef(_,uVar8);
        if (((pIVar13 == (Instruction *)0x0) ||
            (bVar4 = ValidationState_t::IsIntScalarType(_,(pIVar13->inst_).type_id), !bVar4)) ||
           (iVar7 = spvOpcodeIsConstant((uint)(pIVar13->inst_).opcode), iVar7 == 0)) {
          ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
          pcVar21 = "OpTypeCooperativeMatrix Scope <id> ";
          lVar18 = 0x23;
        }
        else {
          uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,3);
          pIVar13 = ValidationState_t::FindDef(_,uVar8);
          if (((pIVar13 == (Instruction *)0x0) ||
              (bVar4 = ValidationState_t::IsIntScalarType(_,(pIVar13->inst_).type_id), !bVar4)) ||
             (iVar7 = spvOpcodeIsConstant((uint)(pIVar13->inst_).opcode), iVar7 == 0)) {
            ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
            pcVar21 = "OpTypeCooperativeMatrix Rows <id> ";
          }
          else {
            uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,4);
            pIVar13 = ValidationState_t::FindDef(_,uVar8);
            if (((pIVar13 != (Instruction *)0x0) &&
                (bVar4 = ValidationState_t::IsIntScalarType(_,(pIVar13->inst_).type_id), bVar4)) &&
               (iVar7 = spvOpcodeIsConstant((uint)(pIVar13->inst_).opcode), iVar7 != 0)) {
              if ((inst->inst_).opcode == 0x1168) {
                sVar9 = Instruction::GetOperandAs<unsigned_int>(inst,5);
                pIVar13 = ValidationState_t::FindDef(_,sVar9);
                if (((pIVar13 == (Instruction *)0x0) ||
                    (bVar4 = ValidationState_t::IsIntScalarType(_,(pIVar13->inst_).type_id), !bVar4)
                    ) || (iVar7 = spvOpcodeIsConstant((uint)(pIVar13->inst_).opcode), iVar7 == 0)) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_228,"OpTypeCooperativeMatrixKHR Use <id> ",0x24);
                  ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,sVar9);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_228,
                             " is not a constant instruction with scalar integer type.",0x38);
                  if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
                    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
                  }
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_228);
                  bVar4 = false;
                }
                else {
                  bVar4 = true;
                  local_58 = sVar9;
                }
                sVar9 = local_58;
                if (!bVar4) goto joined_r0x0030c4e4;
              }
              sVar9 = SPV_SUCCESS;
              goto joined_r0x0030c4e4;
            }
            ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
            pcVar21 = "OpTypeCooperativeMatrix Cols <id> ";
          }
          lVar18 = 0x22;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar21,lVar18);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,uVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
        pcVar21 = " is not a constant instruction with scalar integer type.";
        lVar18 = 0x38;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar21,lVar18);
      sVar9 = local_58;
      goto LAB_0030c4bb;
    }
    goto switchD_0030b2af_caseD_19;
  }
  switch(uVar1) {
  case 0x15:
    uVar8 = Instruction::GetOperandAs<unsigned_int_const>(inst,1);
    switch(uVar8 << 0x1d | uVar8 - 8 >> 3) {
    case 0:
      if ((_->features_).declare_int8_type != false) {
LAB_0030d0ba:
        local_2b0 = SPV_SUCCESS;
        goto LAB_0030d33e;
      }
      ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar21 = 
      "Using an 8-bit integer type requires the Int8 capability, or an extension that explicitly enables 8-bit integers."
      ;
      lVar18 = 0x71;
      break;
    case 1:
      if ((_->features_).declare_int16_type != false) goto LAB_0030d0ba;
      ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar21 = 
      "Using a 16-bit integer type requires the Int16 capability, or an extension that explicitly enables 16-bit integers."
      ;
      lVar18 = 0x73;
      break;
    default:
      ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,"Invalid number of bits (",0x18);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
      pcVar21 = ") used for OpTypeInt.";
      lVar18 = 0x15;
      break;
    case 3:
      uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      if (uVar8 < 2) {
        local_2b0 = SPV_SUCCESS;
        if ((((inst->inst_).opcode != 0x15) ||
            (bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Kernel), !bVar4))
           || (uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,2), uVar8 == 0))
        goto LAB_0030d33e;
        ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_BINARY,inst);
        pcVar21 = "The Signedness in OpTypeInt must always be 0 when Kernel capability is used.";
        lVar18 = 0x4c;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_VALUE,inst);
        pcVar21 = "OpTypeInt has invalid signedness:";
        lVar18 = 0x21;
      }
      break;
    case 7:
      bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Int64);
      if (bVar4) goto LAB_0030d0ba;
      ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar21 = "Using a 64-bit integer type requires the Int64 capability.";
      lVar18 = 0x3a;
    }
    goto LAB_0030ccbc;
  case 0x16:
    uVar8 = Instruction::GetOperandAs<unsigned_int_const>(inst,1);
    sVar9 = SPV_SUCCESS;
    if (uVar8 == 0x40) {
      bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Float64);
      if (!bVar4) {
        ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,"Using a 64-bit floating point ",0x1e);
        pcVar21 = "type requires the Float64 capability.";
        lVar18 = 0x25;
        goto LAB_0030c5ba;
      }
    }
    else if (uVar8 != 0x20) {
      if (uVar8 == 0x10) {
        if ((_->features_).declare_float16_type != false) break;
        ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,"Using a 16-bit floating point ",0x1e);
        pcVar21 = 
        "type requires the Float16 or Float16Buffer capability, or an extension that explicitly enables 16-bit floating point."
        ;
        lVar18 = 0x75;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,"Invalid number of bits (",0x18);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
        pcVar21 = ") used for OpTypeFloat.";
        lVar18 = 0x17;
      }
LAB_0030c5ba:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar21,lVar18);
      sVar9 = local_58;
      goto LAB_0030c5cc;
    }
    break;
  case 0x17:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar13 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar13 == (Instruction *)0x0) ||
       (iVar7 = spvOpcodeIsScalarType((uint)(pIVar13->inst_).opcode), iVar7 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,"OpTypeVector Component Type <id> ",0x21);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
      pcVar21 = " is not a scalar type.";
      lVar18 = 0x16;
LAB_0030c3ac:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar21,lVar18);
      local_2b0 = local_58;
LAB_0030c3bc:
      if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
        operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
      }
    }
    else {
      uVar8 = Instruction::GetOperandAs<unsigned_int_const>(inst,2);
      local_2b0 = SPV_SUCCESS;
      if (uVar8 - 2 < 3) goto LAB_0030d33e;
      if ((uVar8 == 0x10) || (uVar8 == 8)) {
        bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,Vector16);
        if (bVar4) goto LAB_0030d33e;
        ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"Having ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228," components for ",0x10);
        local_2a8._0_8_ = spvOpcodeString((uint)(inst->inst_).opcode);
        pDVar12 = DiagnosticStream::operator<<((DiagnosticStream *)&local_228,(char **)local_2a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar12," requires the Vector16 capability",0x21);
        local_2b0 = pDVar12->error_;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,"Illegal number of components (",0x1e);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,") for ",6);
        local_2a8._0_8_ = spvOpcodeString((uint)(inst->inst_).opcode);
        pDVar12 = DiagnosticStream::operator<<((DiagnosticStream *)&local_228,(char **)local_2a8);
        local_2b0 = pDVar12->error_;
      }
    }
    goto LAB_0030cccd;
  case 0x18:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar13 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar13 == (Instruction *)0x0) || ((pIVar13->inst_).opcode != 0x17)) {
      ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
      pcVar21 = "Columns in a matrix must be of type vector.";
      lVar18 = 0x2b;
    }
    else {
      uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar13,1);
      pIVar13 = ValidationState_t::FindDef(_,uVar8);
      if ((pIVar13->inst_).opcode == 0x16) {
        uVar8 = Instruction::GetOperandAs<unsigned_int_const>(inst,2);
        local_2b0 = SPV_SUCCESS;
        if (0xfffffffc < uVar8 - 5) goto LAB_0030d33e;
        ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar21 = "Matrix types can only be parameterized as having only 2, 3, or 4 columns.";
        lVar18 = 0x49;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar21 = "Matrix types can only be parameterized with floating-point types.";
        lVar18 = 0x41;
      }
    }
    goto LAB_0030ccbc;
  default:
    goto switchD_0030b2af_caseD_19;
  case 0x1c:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar13 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar13 == (Instruction *)0x0) ||
       (iVar7 = spvOpcodeGeneratesType((uint)(pIVar13->inst_).opcode), iVar7 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
      pcVar21 = "OpTypeArray Element Type <id> ";
      lVar18 = 0x1e;
LAB_0030c2e5:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar21,lVar18);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
      pcVar21 = " is not a type.";
      lVar18 = 0xf;
LAB_0030c31a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar21,lVar18);
      sVar9 = local_58;
    }
    else {
      if ((pIVar13->inst_).opcode == 0x13) {
        ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
        pcVar21 = "OpTypeArray Element Type <id> ";
        lVar18 = 0x1e;
LAB_0030b9ad:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar21,lVar18);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,uVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
        pcVar21 = " is a void type.";
        lVar18 = 0x10;
        goto LAB_0030c31a;
      }
      bVar4 = spvIsVulkanEnv(_->context_->target_env);
      if ((!bVar4) || ((pIVar13->inst_).opcode != 0x1d)) {
        uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        pIVar13 = ValidationState_t::FindDef(_,uVar8);
        if ((pIVar13 != (Instruction *)0x0) &&
           (iVar7 = spvOpcodeIsConstant((uint)(pIVar13->inst_).opcode), iVar7 != 0)) {
          this = &local_268;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,&pIVar13->words_);
          pIVar13 = ValidationState_t::FindDef
                              (_,*(uint32_t *)(local_268._M_unused._M_function_pointer + 4));
          if ((pIVar13 == (Instruction *)0x0) || ((pIVar13->inst_).opcode != 0x15)) {
            ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_228,"OpTypeArray Length <id> ",0x18);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,uVar8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_228," is not a constant integer type.",0x20);
            if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
              operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_228);
            sVar9 = local_58;
          }
          else {
            bVar4 = ValidationState_t::EvalConstantValInt64(_,uVar8,(int64_t *)(local_258 + 0x10));
            if (bVar4) {
              if ((CONCAT44(iStack_244,local_258._16_4_) == 0) ||
                 ((bVar4 = true, iStack_244 < 0 &&
                  ((pIVar13->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start[3] != 0)))) {
                ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_228,"OpTypeArray Length <id> ",0x18);
                ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,uVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_228," default value must be at least 1: found ",0x29);
                std::ostream::_M_insert<long>((long)&local_228);
                this = (_Any_data *)(ulong)(uint)local_58;
                if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
                  operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
                }
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_228);
                bVar4 = false;
              }
              sVar9 = (spv_result_t)this;
              if (!bVar4) goto LAB_0030d1cd;
            }
            sVar9 = SPV_SUCCESS;
          }
LAB_0030d1cd:
          if ((ValidationState_t *)local_268._M_unused._0_8_ != (ValidationState_t *)0x0) {
            operator_delete(local_268._M_unused._M_object,local_258._0_8_ - local_268._0_8_);
          }
          break;
        }
        ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,"OpTypeArray Length <id> ",0x18);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,uVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
        pcVar21 = " is not a scalar constant type.";
        lVar18 = 0x1f;
        goto LAB_0030c31a;
      }
      ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2a8,_,0x1248,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
      pcVar21 = "OpTypeArray Element Type <id> ";
      lVar18 = 0x1e;
LAB_0030cba9:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar21,lVar18);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_268,_,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,(char *)local_268._M_unused._0_8_,local_268._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228," is not valid in ",0x11);
      spvLogStringForEnv_abi_cxx11_((string *)(local_258 + 0x10),_->context_->target_env);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,(char *)CONCAT44(iStack_244,local_258._16_4_),(long)local_240
                );
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228," environments.",0xe)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(iStack_244,local_258._16_4_) != &local_238) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(iStack_244,local_258._16_4_),local_238._M_allocated_capacity + 1
                       );
      }
      sVar9 = local_58;
      if ((ValidationState_t *)local_268._M_unused._0_8_ != (ValidationState_t *)local_258) {
        operator_delete(local_268._M_unused._M_object,
                        (ulong)((long)(spv_target_env *)local_258._0_8_ + 1));
      }
    }
    if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
LAB_0030c5cc:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_228);
    break;
  case 0x1d:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar13 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar13 == (Instruction *)0x0) ||
       (iVar7 = spvOpcodeGeneratesType((uint)(pIVar13->inst_).opcode), iVar7 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
      pcVar21 = "OpTypeRuntimeArray Element Type <id> ";
      lVar18 = 0x25;
      goto LAB_0030c2e5;
    }
    if ((pIVar13->inst_).opcode == 0x13) {
      ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
      pcVar21 = "OpTypeRuntimeArray Element Type <id> ";
      lVar18 = 0x25;
      goto LAB_0030b9ad;
    }
    bVar4 = spvIsVulkanEnv(_->context_->target_env);
    sVar9 = SPV_SUCCESS;
    if ((bVar4) && ((pIVar13->inst_).opcode == 0x1d)) {
      ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2a8,_,0x1248,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
      pcVar21 = "OpTypeRuntimeArray Element Type <id> ";
      lVar18 = 0x25;
      goto LAB_0030cba9;
    }
    break;
  case 0x1e:
    local_26c = Instruction::GetOperandAs<unsigned_int>(inst,0);
    bVar4 = 0x10 < (ulong)((long)(inst->operands_).
                                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
    if (bVar4) {
      sVar22 = 1;
      bVar4 = true;
      do {
        uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,sVar22);
        if (uVar8 == (inst->inst_).result_id) {
          ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228,"Structure members may not be self references",0x2c);
          local_2b0 = local_58;
LAB_0030bc7c:
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_228);
          bVar6 = false;
        }
        else {
          pIVar13 = ValidationState_t::FindDef(_,uVar8);
          if ((pIVar13 == (Instruction *)0x0) ||
             (iVar7 = spvOpcodeGeneratesType((uint)(pIVar13->inst_).opcode), iVar7 == 0)) {
            ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_228,"OpTypeStruct Member Type <id> ",0x1e);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,uVar8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_228," is not a type.",0xf);
            local_2b0 = local_58;
            if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
              operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
            }
LAB_0030bd90:
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_228);
            bVar6 = false;
          }
          else {
            uVar2 = (pIVar13->inst_).opcode;
            if (uVar2 == 0x1e) {
              bVar6 = ValidationState_t::IsStructTypeWithBuiltInMember(_,uVar8);
              if (!bVar6) goto LAB_0030bf11;
              ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_228,"Structure <id> ",0xf);
              ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,uVar8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_228,
                         " contains members with BuiltIn decoration. Therefore this ",0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_228,
                         "structure may not be contained as a member of another ",0x36);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_228,"structure ",10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_228,"type. Structure <id> ",0x15);
              ValidationState_t::getIdName_abi_cxx11_((string *)&local_268,_,local_26c);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_228,(char *)local_268._M_unused._0_8_,local_268._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_228," contains structure <id> ",0x19);
              ValidationState_t::getIdName_abi_cxx11_((string *)(local_258 + 0x10),_,uVar8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_228,(char *)CONCAT44(iStack_244,local_258._16_4_),
                         (long)local_240);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,".",1);
              local_2b0 = local_58;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(iStack_244,local_258._16_4_) != &local_238) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(iStack_244,local_258._16_4_),
                                local_238._M_allocated_capacity + 1);
              }
LAB_0030c0b5:
              if ((ValidationState_t *)local_268._M_unused._0_8_ != (ValidationState_t *)local_258)
              {
LAB_0030c0c9:
                operator_delete(local_268._M_unused._M_object,
                                (ulong)((long)(spv_target_env *)local_258._0_8_ + 1));
              }
LAB_0030c0d6:
              if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
                operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
              }
              goto LAB_0030bc7c;
            }
            if (uVar2 == 0x13) {
              ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_228,"Structures cannot contain a void type.",0x26);
              local_2b0 = local_58;
              goto LAB_0030bd90;
            }
LAB_0030bf11:
            bVar5 = spvIsVulkanEnv(_->context_->target_env);
            bVar6 = true;
            if ((bVar5) && ((pIVar13->inst_).opcode == 0x1d)) {
              if (sVar22 != ((long)(inst->operands_).
                                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(inst->operands_).
                                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U) {
                ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
                ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2a8,_,0x1248,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"In ",3);
                spvLogStringForEnv_abi_cxx11_((string *)&local_268,_->context_->target_env);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_228,(char *)local_268._M_unused._0_8_,local_268._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_228,
                           ", OpTypeRuntimeArray must only be used for the last member of an OpTypeStruct"
                           ,0x4d);
                local_2b0 = local_58;
                goto LAB_0030c0b5;
              }
              bVar5 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,Block);
              if ((!bVar5) &&
                 (bVar5 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,BufferBlock),
                 !bVar5)) {
                ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
                ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2a8,_,0x1248,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
                spvLogStringForEnv_abi_cxx11_((string *)&local_268,_->context_->target_env);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_228,(char *)local_268._M_unused._0_8_,local_268._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_228,", OpTypeStruct containing an OpTypeRuntimeArray ",
                           0x30);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_228,"must be decorated with Block or BufferBlock.",0x2c
                          );
                local_2b0 = local_58;
                if ((ValidationState_t *)local_268._M_unused._0_8_ != (ValidationState_t *)local_258
                   ) goto LAB_0030c0c9;
                goto LAB_0030c0d6;
              }
            }
          }
        }
        if (!bVar6) break;
        sVar22 = sVar22 + 1;
        bVar4 = sVar22 < (ulong)((long)(inst->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(inst->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      } while (bVar4);
    }
    if (!bVar4) {
      puVar14 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(inst->words_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar14) < 9) {
        mVar19 = false;
      }
      else {
        uVar23 = 2;
        mVar19 = false;
        do {
          pIVar13 = ValidationState_t::FindDef(_,puVar14[uVar23]);
          if ((pIVar13 != (Instruction *)0x0) && ((pIVar13->inst_).opcode == 0x1e)) {
            bVar4 = ValidationState_t::HasDecoration(_,(pIVar13->inst_).result_id,Block);
            if ((!bVar4) &&
               (bVar4 = ValidationState_t::HasDecoration(_,(pIVar13->inst_).result_id,BufferBlock),
               !bVar4)) {
              local_228._M_nxt._0_4_ = (pIVar13->inst_).result_id;
              pmVar15 = std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&_->struct_has_nested_blockorbufferblock_struct_,
                                     (key_type *)&local_228);
              if (*pmVar15 != true) goto LAB_0030c19a;
            }
            mVar19 = true;
          }
LAB_0030c19a:
          uVar23 = uVar23 + 1;
          puVar14 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar23 < (ulong)((long)(inst->words_).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar14
                                 >> 2));
      }
      local_228._M_nxt._0_4_ = (inst->inst_).result_id;
      pmVar15 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&_->struct_has_nested_blockorbufferblock_struct_,
                             (key_type *)&local_228);
      *pmVar15 = mVar19;
      local_228._M_nxt._0_4_ = (inst->inst_).result_id;
      pmVar15 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&_->struct_has_nested_blockorbufferblock_struct_,
                             (key_type *)&local_228);
      if ((*pmVar15 == false) ||
         ((bVar4 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,BufferBlock), !bVar4
          && (bVar4 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,Block), !bVar4))))
      {
        local_2a8._0_8_ = &p_Stack_278;
        local_2a8._8_8_ = (spv_const_validator_options)0x1;
        local_2a8._16_8_ = 0;
        local_2a8._24_8_ = 0;
        local_288 = 1.0;
        local_280 = 0;
        p_Stack_278 = (__node_base_ptr)0x0;
        local_228._M_nxt._0_4_ = local_26c;
        pmVar16 = std::
                  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                  ::operator[](&_->id_decorations_,(key_type_conflict *)&local_228);
        p_Var17 = (pmVar16->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var24 = &(pmVar16->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var17 != p_Var24) {
          do {
            local_228._M_nxt._0_4_ = p_Var17[1]._M_color;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_220,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var17[1]._M_parent)
            ;
            local_208 = p_Var17[2]._M_color;
            if (((_Rb_tree_color)local_228._M_nxt == 0xb) && (local_208 != ~_S_red)) {
              local_268._M_unused._M_object = (ValidationState_t *)local_2a8;
              local_258._16_4_ = local_208;
              std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)local_2a8,local_258 + 0x10,&local_268);
            }
            if ((__buckets_ptr)
                local_220.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (__buckets_ptr)0x0) {
              operator_delete(local_220.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_220.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_220.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
          } while ((_Rb_tree_header *)p_Var17 != p_Var24);
        }
        if (((int)local_2a8._24_4_ < 1) ||
           ((int)((ulong)((long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1 ==
            local_2a8._24_4_)) {
          if (0 < (int)local_2a8._24_4_) {
            local_268._0_4_ = local_26c;
            local_228._M_nxt = (_Hash_node_base *)&_->builtin_structs_;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      ();
          }
          bVar4 = spvIsVulkanEnv(_->context_->target_env);
          if ((bVar4) && (_->options_->before_hlsl_legalization == false)) {
            local_268._8_8_ = 0;
            local_258._8_8_ =
                 std::
                 _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_type.cpp:383:29)>
                 ::_M_invoke;
            local_258._0_8_ =
                 std::
                 _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_type.cpp:383:29)>
                 ::_M_manager;
            local_268._M_unused._M_object = _;
            bVar6 = ValidationState_t::ContainsType
                              (_,(inst->inst_).result_id,
                               (function<bool_(const_spvtools::val::Instruction_*)> *)&local_268,
                               true);
            bVar4 = true;
          }
          else {
            bVar4 = false;
            bVar6 = false;
          }
          if ((bVar4) && ((spv_const_context)local_258._0_8_ != (spv_const_context)0x0)) {
            (*(code *)local_258._0_8_)(&local_268,&local_268,3);
          }
          local_2b0 = SPV_SUCCESS;
          if (bVar6 != false) {
            ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
            ValidationState_t::VkErrorID_abi_cxx11_
                      ((string *)(local_258 + 0x10),_,0x123b,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_228,(char *)CONCAT44(iStack_244,local_258._16_4_),
                       (long)local_240);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"In ",3);
            spvLogStringForEnv_abi_cxx11_(&local_50,_->context_->target_env);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_228,local_50._M_dataplus._M_p,local_50._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_228,", OpTypeStruct must not contain an opaque type.",0x2f)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,
                              (ulong)(local_50.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(iStack_244,local_258._16_4_) != &local_238) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(iStack_244,local_258._16_4_),
                              local_238._M_allocated_capacity + 1);
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_228);
            local_2b0 = local_58;
          }
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228,
                     "When BuiltIn decoration is applied to a structure-type member, ",0x3f);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228,
                     "all members of that structure type must also be decorated with ",0x3f);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228,"BuiltIn (No allowed mixing of built-in variables and ",
                     0x35);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228,
                     "non-built-in variables within a single structure). Structure id ",0x40);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228," does not meet this requirement.",0x20);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_228);
          local_2b0 = local_58;
        }
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_2a8);
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,
                   "rules: A Block or BufferBlock cannot be nested within another Block or BufferBlock. "
                   ,0x54);
        local_2b0 = local_58;
LAB_0030cb2d:
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_228);
      }
    }
    goto LAB_0030d33e;
  case 0x20:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar13 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar13 == (Instruction *)0x0) ||
       (iVar7 = spvOpcodeGeneratesType((uint)(pIVar13->inst_).opcode), iVar7 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,"OpTypePointer Type <id> ",0x18);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
      pcVar21 = " is not a type.";
      lVar18 = 0xf;
    }
    else {
      SVar11 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
      if (SVar11 == UniformConstant) {
        if (((pIVar13->inst_).opcode & 0xfffe) == 0x1c) {
          uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar13,1);
          pIVar13 = ValidationState_t::FindDef(_,uVar8);
        }
        if (((pIVar13->inst_).opcode == 0x19) &&
           (uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar13,6), uVar8 == 2)) {
          local_2a8._0_4_ = (inst->inst_).result_id;
          local_228._M_nxt = (_Hash_node_base *)&_->pointer_to_storage_image_;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ();
        }
      }
      bVar4 = ValidationState_t::IsValidStorageClass(_,SVar11);
      sVar9 = SPV_SUCCESS;
      if (bVar4) break;
      ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_BINARY,inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2a8,_,0x1223,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
      pcVar21 = "Invalid storage class for target environment";
      lVar18 = 0x2c;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar21,lVar18);
    sVar9 = local_58;
LAB_0030c4bb:
    if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_228);
    break;
  case 0x21:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar13 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar13 == (Instruction *)0x0) ||
       (iVar7 = spvOpcodeGeneratesType((uint)(pIVar13->inst_).opcode), iVar7 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,"OpTypeFunction Return Type <id> ",0x20);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
      pcVar21 = " is not a type.";
      lVar18 = 0xf;
      goto LAB_0030c3ac;
    }
    bVar6 = (ulong)((long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x21;
    bVar4 = !bVar6;
    if (bVar6) {
      uVar23 = 0;
      local_2b0 = unaff_EBP;
    }
    else {
      sVar22 = 2;
      bVar4 = true;
      do {
        uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,sVar22);
        pIVar13 = ValidationState_t::FindDef(_,uVar8);
        if ((pIVar13 == (Instruction *)0x0) ||
           (iVar7 = spvOpcodeGeneratesType((uint)(pIVar13->inst_).opcode), iVar7 == 0)) {
          ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228,"OpTypeFunction Parameter Type <id> ",0x23);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,uVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
          lVar18 = 0xf;
          pcVar21 = " is not a type.";
LAB_0030b7d8:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar21,lVar18);
          local_2b0 = local_58;
          if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_228);
          bVar6 = false;
        }
        else {
          bVar6 = true;
          if ((pIVar13->inst_).opcode == 0x13) {
            ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_228,"OpTypeFunction Parameter Type <id> ",0x23);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,uVar8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
            lVar18 = 0x16;
            pcVar21 = " cannot be OpTypeVoid.";
            goto LAB_0030b7d8;
          }
        }
        if (!bVar6) break;
        sVar22 = sVar22 + 1;
        bVar4 = sVar22 < (ulong)((long)(inst->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(inst->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      } while (bVar4);
      uVar23 = sVar22 - 2;
    }
    if (!bVar4) {
      if ((_->options_->universal_limits_).max_function_args < uVar23) {
        ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,"OpTypeFunction may not take more than ",0x26);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228," arguments. OpTypeFunction <id> ",0x20);
        uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,0);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,uVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228," has ",5);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228," arguments.",0xb);
        local_2b0 = local_58;
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
        }
        goto LAB_0030cb2d;
      }
      ppVar3 = (inst->uses_).
               super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar20 = (inst->uses_).
                     super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar20 != ppVar3;
          ppVar20 = ppVar20 + 1) {
        pIVar13 = ppVar20->first;
        bVar4 = true;
        opcode = (Op)(pIVar13->inst_).opcode;
        if ((((opcode != OpFunction) && (bVar6 = spvOpcodeIsDebug(opcode), !bVar6)) &&
            (bVar6 = Instruction::IsNonSemantic(pIVar13), !bVar6)) &&
           (bVar6 = spvOpcodeIsDecoration((uint)(pIVar13->inst_).opcode), !bVar6)) {
          ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,pIVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228,"Invalid use of function type result id ",0x27);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_2a8,_,(inst->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,".",1);
          local_2b0 = local_58;
          if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_228);
          bVar4 = false;
        }
        if (!bVar4) goto LAB_0030d33e;
      }
      local_2b0 = SPV_SUCCESS;
    }
    goto LAB_0030d33e;
  case 0x27:
    uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar13 = ValidationState_t::FindDef(_,uVar8);
    if ((pIVar13->inst_).opcode == 0x20) {
      SVar11 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
      SVar10 = Instruction::GetOperandAs<spv::StorageClass>(pIVar13,1);
      if (SVar11 == SVar10) {
        uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar13,2);
        pIVar13 = ValidationState_t::FindDef(_,uVar8);
        if ((pIVar13 != (Instruction *)0x0) && ((pIVar13->inst_).opcode == 0x1e)) {
          bVar4 = spvIsVulkanEnv(_->context_->target_env);
          local_2b0 = SPV_SUCCESS;
          if ((SVar11 == PhysicalStorageBuffer) || (!bVar4)) goto LAB_0030d33e;
          ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)local_2a8,_,0x1267,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228,(char *)local_2a8._0_8_,local_2a8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228,"In Vulkan, OpTypeForwardPointer must have ",0x2a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228,"a storage class of PhysicalStorageBuffer.",0x29);
          local_2b0 = local_58;
          goto LAB_0030c3bc;
        }
        ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
        pcVar21 = "Forward pointers must point to a structure";
        lVar18 = 0x2a;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_228,"Storage class in OpTypeForwardPointer does not match the "
                   ,0x39);
        pcVar21 = "pointer definition.";
        lVar18 = 0x13;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)&local_228,_,SPV_ERROR_INVALID_ID,inst);
      pcVar21 = "Pointer type in OpTypeForwardPointer is not a pointer type.";
      lVar18 = 0x3b;
    }
LAB_0030ccbc:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,pcVar21,lVar18);
    local_2b0 = local_58;
LAB_0030cccd:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_228);
LAB_0030d33e:
    if (local_2b0 != SPV_SUCCESS) {
      return local_2b0;
    }
    goto switchD_0030b2af_caseD_19;
  }
joined_r0x0030c4e4:
  if (sVar9 == SPV_SUCCESS) {
switchD_0030b2af_caseD_19:
    sVar9 = SPV_SUCCESS;
  }
  return sVar9;
}

Assistant:

spv_result_t TypePass(ValidationState_t& _, const Instruction* inst) {
  if (!spvOpcodeGeneratesType(inst->opcode()) &&
      inst->opcode() != spv::Op::OpTypeForwardPointer) {
    return SPV_SUCCESS;
  }

  if (auto error = ValidateUniqueness(_, inst)) return error;

  switch (inst->opcode()) {
    case spv::Op::OpTypeInt:
      if (auto error = ValidateTypeInt(_, inst)) return error;
      break;
    case spv::Op::OpTypeFloat:
      if (auto error = ValidateTypeFloat(_, inst)) return error;
      break;
    case spv::Op::OpTypeVector:
      if (auto error = ValidateTypeVector(_, inst)) return error;
      break;
    case spv::Op::OpTypeMatrix:
      if (auto error = ValidateTypeMatrix(_, inst)) return error;
      break;
    case spv::Op::OpTypeArray:
      if (auto error = ValidateTypeArray(_, inst)) return error;
      break;
    case spv::Op::OpTypeRuntimeArray:
      if (auto error = ValidateTypeRuntimeArray(_, inst)) return error;
      break;
    case spv::Op::OpTypeStruct:
      if (auto error = ValidateTypeStruct(_, inst)) return error;
      break;
    case spv::Op::OpTypePointer:
      if (auto error = ValidateTypePointer(_, inst)) return error;
      break;
    case spv::Op::OpTypeFunction:
      if (auto error = ValidateTypeFunction(_, inst)) return error;
      break;
    case spv::Op::OpTypeForwardPointer:
      if (auto error = ValidateTypeForwardPointer(_, inst)) return error;
      break;
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      if (auto error = ValidateTypeCooperativeMatrix(_, inst)) return error;
      break;
    case spv::Op::OpTypeUntypedPointerKHR:
      if (auto error = ValidateTypeUntypedPointerKHR(_, inst)) return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}